

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subdivpatch1base_eval.cpp
# Opt level: O1

void embree::avx::evalGrid
               (SubdivPatch1Base *patch,uint x0,uint x1,uint y0,uint y1,uint swidth,uint sheight,
               float *grid_x,float *grid_y,float *grid_z,float *grid_u,float *grid_v,
               SubdivMesh *geom)

{
  ulong uVar1;
  undefined8 *puVar2;
  anon_union_16_2_47237d3f_for_Vec3fa_0 *paVar3;
  anon_union_16_2_47237d3f_for_Vec3fa_0 *paVar4;
  size_t size;
  pointer pRVar5;
  uint *puVar6;
  BufferView<embree::Vec3fa> *pBVar7;
  char *pcVar8;
  code *pcVar9;
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined8 uVar18;
  undefined8 uVar19;
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  anon_union_16_2_47237d3f_for_Vec3fa_0 *paVar23;
  uint uVar24;
  int iVar25;
  size_t i_1;
  float *pfVar27;
  long lVar28;
  void *pvVar29;
  anon_union_32_3_4e90abd3_for_vfloat_impl<8>_1 *Ny;
  uint uVar30;
  int iVar31;
  int iVar32;
  uint uVar33;
  uint uVar34;
  long lVar35;
  uint *puVar36;
  float *pfVar37;
  int iVar38;
  undefined4 *puVar39;
  uint *puVar40;
  uint uVar41;
  ulong uVar42;
  uint uVar43;
  float *pfVar44;
  anon_union_32_3_4e90abd3_for_vfloat_impl<8>_1 *paVar45;
  ulong uVar46;
  anon_union_32_3_4e90abd3_for_vfloat_impl<8>_1 *paVar47;
  uint uVar48;
  uint *puVar49;
  uint dwidth;
  bool bVar50;
  undefined1 auVar52 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar51 [16];
  undefined1 auVar58 [32];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  float fVar69;
  undefined1 auVar63 [16];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  float fVar68;
  float fVar70;
  float fVar71;
  float fVar72;
  undefined1 in_ZMM3 [64];
  float fVar73;
  float fVar78;
  undefined1 auVar74 [16];
  undefined1 auVar75 [32];
  float fVar76;
  float fVar77;
  float fVar79;
  float fVar80;
  float fVar81;
  undefined1 in_ZMM4 [64];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [32];
  undefined1 in_ZMM5 [64];
  undefined1 auVar86 [16];
  undefined1 auVar87 [32];
  float fVar88;
  float fVar93;
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  float fVar91;
  float fVar92;
  float fVar94;
  float fVar95;
  float fVar96;
  undefined1 in_ZMM7 [64];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar107 [16];
  undefined1 auVar101 [32];
  undefined1 auVar99 [16];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar100 [16];
  undefined1 auVar105 [32];
  undefined1 auVar106 [64];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 in_ZMM10 [64];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  float fVar124;
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar126 [16];
  undefined1 auVar127 [32];
  undefined1 auVar125 [16];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 in_ZMM13 [64];
  float in_register_0000159c;
  float fVar130;
  float fVar131;
  float fVar132;
  float fVar133;
  float fVar134;
  undefined1 in_ZMM15 [64];
  uint x;
  vfloatx_conflict v;
  RTCDisplacementFunctionNArguments args;
  Vec3vfx_conflict normal;
  Vec3vfx_conflict vtx;
  vfloatx_conflict u;
  uint local_4ebc;
  uint local_4eb8;
  float local_4eb4;
  ulong local_4ea8;
  anon_union_32_3_4e90abd3_for_vfloat_impl<8>_1 local_4de0;
  anon_union_32_3_4e90abd3_for_vfloat_impl<8>_1 local_4dc0;
  anon_union_32_3_4e90abd3_for_vfloat_impl<8>_1 *local_4da0;
  anon_union_32_3_4e90abd3_for_vfloat_impl<8>_1 *paStack_4d98;
  undefined1 *puStack_4d90;
  undefined1 (*pauStack_4d88) [32];
  anon_union_16_2_47237d3f_for_Vec3fa_0 *local_4d80;
  float **ppfStack_4d78;
  anon_union_16_2_47237d3f_for_Vec3fa_0 *paStack_4d70;
  float fStack_4d68;
  undefined4 uStack_4d64;
  anon_union_32_3_4e90abd3_for_vfloat_impl<8>_1 *local_3dc0;
  ulong local_3db8;
  anon_union_32_3_4e90abd3_for_vfloat_impl<8>_1 local_3d80;
  undefined1 local_3d60 [32];
  undefined1 local_3d40 [126] [32];
  anon_union_32_3_4e90abd3_for_vfloat_impl<8>_1 *local_2d80;
  ulong local_2d78;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_2d40;
  uint uStack_2d30;
  uint uStack_2d2c;
  float *pfStack_2d28;
  float *local_2d20;
  anon_union_32_3_4e90abd3_for_vfloat_impl<8>_1 *paStack_2d18;
  anon_union_32_3_4e90abd3_for_vfloat_impl<8>_1 *paStack_2d10;
  anon_union_32_3_4e90abd3_for_vfloat_impl<8>_1 *paStack_2d08;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_2d00;
  float *pfStack_2cf0;
  uint uStack_2ce8;
  undefined4 uStack_2ce4;
  undefined4 local_29dc [1575];
  anon_union_16_2_47237d3f_for_Vec3fa_0 *local_1140;
  undefined4 local_1100;
  anon_union_32_3_4e90abd3_for_vfloat_impl<8>_1 local_10c0 [128];
  anon_union_32_3_4e90abd3_for_vfloat_impl<8>_1 *local_c0;
  ulong local_b8;
  ulong uVar26;
  
  auVar53 = in_ZMM7._0_16_;
  uVar33 = x1 - x0;
  dwidth = uVar33 + 1;
  iVar38 = y1 - y0;
  uVar41 = iVar38 + 1;
  uVar24 = uVar41 * dwidth;
  uVar26 = (ulong)uVar24;
  uVar43 = uVar24 + 7;
  uVar48 = uVar43 >> 3;
  if (patch->type == '\x05') {
    local_3db8 = (ulong)(uVar24 + 8);
    Ny = *(anon_union_32_3_4e90abd3_for_vfloat_impl<8>_1 **)&(geom->super_Geometry).field_0x58;
    if (Ny == (anon_union_32_3_4e90abd3_for_vfloat_impl<8>_1 *)0x0) {
      local_3db8 = 0;
    }
    size = local_3db8 * 4;
    local_2d78 = local_3db8;
    local_b8 = local_3db8;
    if (local_3db8 < 0x401) {
      local_2d80 = &local_3d80;
      local_3dc0 = &local_4dc0;
      local_c0 = local_10c0;
    }
    else {
      local_2d80 = (anon_union_32_3_4e90abd3_for_vfloat_impl<8>_1 *)alignedMalloc(size,0x40);
      local_3dc0 = (anon_union_32_3_4e90abd3_for_vfloat_impl<8>_1 *)alignedMalloc(size,0x40);
      local_c0 = (anon_union_32_3_4e90abd3_for_vfloat_impl<8>_1 *)alignedMalloc(size,0x40);
    }
    auVar53 = in_ZMM10._0_16_;
    pRVar5 = (geom->patch_eval_trees).
             super__Vector_base<embree::PatchT<embree::Vec3fa,_embree::Vec3fa>::Ref,_std::allocator<embree::PatchT<embree::Vec3fa,_embree::Vec3fa>::Ref>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((geom->patch_eval_trees).
        super__Vector_base<embree::PatchT<embree::Vec3fa,_embree::Vec3fa>::Ref,_std::allocator<embree::PatchT<embree::Vec3fa,_embree::Vec3fa>::Ref>_>
        ._M_impl.super__Vector_impl_data._M_finish == pRVar5) {
      puVar6 = *(uint **)&patch->patch_v[0][0].field_0;
      uVar33 = patch->time_;
      pBVar7 = (geom->vertices).items;
      lVar35 = 0x1c00;
      puVar39 = local_29dc;
      do {
        *(undefined4 **)(puVar39 + -0x49) = puVar39 + -0xc9;
        *(undefined4 **)(puVar39 + -0x19) = puVar39 + -0x39;
        *(undefined8 *)(puVar39 + -2) = 0;
        *puVar39 = 0;
        puVar39 = puVar39 + 0xe0;
        lVar35 = lVar35 + -0x380;
      } while (lVar35 != 0);
      local_1140 = &local_2d40;
      pcVar8 = pBVar7[uVar33].super_RawBufferView.ptr_ofs;
      uVar42 = (ulong)(uint)pBVar7[uVar33].super_RawBufferView.stride;
      lVar35 = 0x280;
      uVar46 = 0;
      puVar40 = puVar6;
      do {
        if ((7 < uVar46) && (local_1140 == &local_2d40)) {
          alignedMalloc(0x3840,0x40);
          evalGrid();
          lVar28 = 0;
          do {
            GeneralCatmullClark1RingT<embree::Vec3fa,_embree::Vec3fa>::operator=
                      ((GeneralCatmullClark1RingT<embree::Vec3fa,_embree::Vec3fa> *)
                       ((long)local_1140 + lVar28),
                       (GeneralCatmullClark1RingT<embree::Vec3fa,_embree::Vec3fa> *)
                       ((long)&local_2d40 + lVar28));
            lVar28 = lVar28 + 0x380;
          } while (lVar28 != 0x1c00);
        }
        paVar23 = local_1140;
        uVar1 = uVar46 + 1;
        paVar3 = local_1140 + uVar46 * 0x38;
        paVar4 = local_1140 + uVar46 * 0x38;
        pfVar44 = paVar4->m128 + 0x10;
        *(undefined1 *)(paVar4->m128 + 0xd6) = 1;
        paVar4->m128[0xd2] = -NAN;
        uVar18 = *(undefined8 *)(pcVar8 + *puVar40 * uVar42);
        uVar19 = *(undefined8 *)(pcVar8 + *puVar40 * uVar42 + 8);
        *(float *)paVar4 = (float)(int)uVar18;
        *(int *)((long)paVar4 + 4) = (int)((ulong)uVar18 >> 0x20);
        *(undefined8 *)&(paVar4->field_1).z = uVar19;
        paVar4->m128[0xd3] = (float)puVar40[5];
        paVar4->m128[0xd5] = (float)puVar40[6];
        paVar4->m128[0xd4] = 0.0;
        pfVar37 = local_1140->m128 + uVar46 * 0xe0 + 0x90;
        pfVar27 = local_1140->m128 + uVar46 * 0xe0 + 0xa0;
        local_4ea8 = 0;
        local_4eb4 = -NAN;
        local_4eb8 = 0xffffffff;
        local_4ebc = 0xffffffff;
        fVar73 = 0.0;
        puVar36 = puVar40;
        do {
          uVar33 = puVar36[2];
          uVar30 = puVar36[1];
          auVar53 = vmaxss_avx(ZEXT416(puVar36[6]),ZEXT416((uint)paVar3[0x35].m128[0]));
          uVar34 = puVar36[4];
          paVar3[0x35].m128[0] = auVar53._0_4_;
          bVar50 = puVar36[(long)(int)uVar30 * 8] < local_4ebc;
          if (bVar50) {
            local_4eb4 = fVar73;
          }
          if (bVar50) {
            local_4eb8 = (uint)local_4ea8;
          }
          puVar49 = puVar36 + (long)(int)uVar30 * 8;
          if (bVar50) {
            local_4ebc = puVar36[(long)(int)uVar30 * 8];
          }
          if (uVar30 == uVar33) {
            iVar38 = 0;
          }
          else {
            iVar38 = 0;
            do {
              auVar53 = *(undefined1 (*) [16])(pcVar8 + *puVar49 * uVar42);
              if ((0x20 < (int)fVar73 + iVar38 + 1U) && (*(float **)pfVar37 == pfVar44)) {
                alignedMalloc(0x800,0x10);
                evalGrid();
              }
              *(undefined1 (*) [16])
               (*(long *)(paVar3 + 0x24) + (ulong)(uint)((int)fVar73 + iVar38) * 0x10) = auVar53;
              iVar38 = iVar38 + 1;
              puVar49 = puVar49 + (long)(int)puVar49[1] * 8;
            } while (puVar49 != puVar36 + (long)(int)uVar33 * 8);
            fVar73 = (float)((int)fVar73 + iVar38);
          }
          uVar33 = (uint)local_4ea8 + 1;
          if ((0x10 < uVar33) && (*(float **)(paVar3 + 0x30) == pfVar27)) {
            pvVar29 = operator_new__(0x200);
            *(void **)(paVar3 + 0x30) = pvVar29;
            lVar28 = 0;
            do {
              *(undefined8 *)(*(long *)(paVar3 + 0x30) + lVar28 * 8) =
                   *(undefined8 *)((long)paVar23 + lVar28 * 8 + lVar35);
              lVar28 = lVar28 + 1;
            } while (lVar28 != 0x10);
          }
          lVar28 = *(long *)(paVar3 + 0x30);
          *(int *)(lVar28 + local_4ea8 * 8) = iVar38;
          *(uint *)(lVar28 + local_4ea8 * 8 + 4) = uVar34;
          *(byte *)((long)paVar3 + 0x358) = *(byte *)((long)paVar3 + 0x358) & iVar38 == 2;
          if ((long)(int)puVar49[3] == 0) {
            if (*puVar49 < local_4ebc) {
              local_4ebc = *puVar49;
              local_4eb4 = fVar73;
              local_4eb8 = uVar33;
            }
            *(uint *)((long)paVar3 + 0x348) = uVar33;
            uVar30 = (uint)local_4ea8 + 2;
            if ((0x10 < uVar30) && (*(float **)(paVar3 + 0x30) == pfVar27)) {
              pvVar29 = operator_new__(0x200);
              *(void **)(paVar3 + 0x30) = pvVar29;
              lVar28 = 0;
              do {
                *(undefined8 *)(*(long *)(paVar3 + 0x30) + lVar28 * 8) =
                     *(undefined8 *)((long)paVar23 + lVar28 * 8 + lVar35);
                lVar28 = lVar28 + 1;
              } while (lVar28 != 0x10);
            }
            *(undefined8 *)(*(long *)(paVar3 + 0x30) + (ulong)uVar33 * 8) = 0x7f80000000000002;
            uVar18 = *(undefined8 *)(pcVar8 + *puVar49 * uVar42);
            uVar19 = *(undefined8 *)(pcVar8 + *puVar49 * uVar42 + 8);
            uVar33 = (int)fVar73 + 1;
            if ((0x20 < uVar33) && (*(float **)pfVar37 == pfVar44)) {
              alignedMalloc(0x800,0x10);
              evalGrid();
            }
            puVar2 = (undefined8 *)(*(long *)pfVar37 + (ulong)(uint)fVar73 * 0x10);
            *puVar2 = uVar18;
            puVar2[1] = uVar19;
            fVar73 = (float)((int)fVar73 + 2);
            if ((0x20 < (uint)fVar73) && (*(float **)pfVar37 == pfVar44)) {
              alignedMalloc(0x800,0x10);
              evalGrid();
            }
            *(anon_union_16_2_47237d3f_for_Vec3fa_0 *)
             (*(long *)(paVar3 + 0x24) + (ulong)uVar33 * 0x10) = *paVar3;
            uVar33 = puVar40[3];
            puVar36 = puVar40;
            while (local_4ea8 = (ulong)uVar30, uVar33 != 0) {
              lVar28 = (long)(int)uVar33;
              uVar33 = puVar36[lVar28 * 8 + (long)(int)puVar36[lVar28 * 8 + 1] * 8 + 3];
              puVar36 = puVar36 + lVar28 * 8 + (long)(int)puVar36[lVar28 * 8 + 1] * 8;
            }
          }
          else {
            puVar36 = puVar49 + (long)(int)puVar49[3] * 8;
            local_4ea8 = (ulong)uVar33;
          }
          auVar53 = in_ZMM10._0_16_;
        } while (puVar36 != puVar40);
        *(float *)((long)paVar3 + 0x344) = fVar73;
        paVar3[0x34].m128[0] = (float)local_4ea8;
        *(uint *)((long)paVar3 + 0x364) = local_4ebc;
        *(uint *)((long)paVar3 + 0x35c) = local_4eb8;
        paVar3[0x36].m128[0] = local_4eb4;
        if (0xe < uVar46) break;
        puVar40 = puVar40 + (long)(int)puVar40[1] * 8;
        lVar35 = lVar35 + 0x380;
        uVar46 = uVar1;
      } while (puVar40 != puVar6);
      local_1100 = (undefined4)uVar1;
      pfVar37 = (float *)0x0;
      if ((patch->flags & 0x10) != 0) {
        pfVar37 = patch->level;
      }
      paVar45 = Ny;
      paVar47 = Ny;
      if (Ny != (anon_union_32_3_4e90abd3_for_vfloat_impl<8>_1 *)0x0) {
        Ny = local_3dc0;
        paVar45 = local_c0;
        paVar47 = local_2d80;
      }
      feature_adaptive_eval_grid<embree::avx::FeatureAdaptiveEvalGrid,embree::GeneralCatmullClarkPatchT<embree::Vec3fa,embree::Vec3fa>>
                ((GeneralCatmullClarkPatchT<embree::Vec3fa,_embree::Vec3fa> *)&local_2d40.field_1,
                 (uint)patch->patch_v[0][0].field_0.m128[2],pfVar37,x0,x1,y0,y1,swidth,sheight,
                 grid_x,grid_y,grid_z,grid_u,grid_v,paVar47->v,Ny->v,paVar45->v,dwidth,uVar41);
      GeneralCatmullClarkPatchT<embree::Vec3fa,_embree::Vec3fa>::~GeneralCatmullClarkPatchT
                ((GeneralCatmullClarkPatchT<embree::Vec3fa,_embree::Vec3fa> *)&local_2d40.field_1);
    }
    else {
      pfVar37 = (float *)0x0;
      if ((patch->flags & 0x10) != 0) {
        pfVar37 = patch->level;
      }
      paVar45 = Ny;
      paVar47 = Ny;
      if (Ny != (anon_union_32_3_4e90abd3_for_vfloat_impl<8>_1 *)0x0) {
        Ny = local_3dc0;
        paVar45 = local_c0;
        paVar47 = local_2d80;
      }
      feature_adaptive_eval_grid<embree::avx::PatchEvalGrid,embree::PatchT<embree::Vec3fa,embree::Vec3fa>::Ref>
                (pRVar5 + (ulong)(patch->prim * (geom->super_Geometry).numTimeSteps + patch->time_)
                          * 8,(uint)patch->patch_v[0][0].field_0.m128[2],pfVar37,x0,x1,y0,y1,swidth,
                 sheight,grid_x,grid_y,grid_z,grid_u,grid_v,paVar47->v,Ny->v,paVar45->v,dwidth,
                 uVar41);
    }
    if (7 < uVar43) {
      auVar53 = ZEXT416((uint)((float)patch->u[0] * 0.00012207031));
      auVar54 = vshufps_avx(auVar53,auVar53,0);
      auVar53 = ZEXT416((uint)((float)patch->u[3] * 0.00012207031));
      auVar99 = vshufps_avx(auVar53,auVar53,0);
      auVar53 = ZEXT416((uint)((float)patch->u[1] * 0.00012207031));
      auVar110 = vshufps_avx(auVar53,auVar53,0);
      auVar53 = ZEXT416((uint)((float)patch->u[2] * 0.00012207031));
      auVar120 = vshufps_avx(auVar53,auVar53,0);
      auVar53 = ZEXT416((uint)((float)patch->v[0] * 0.00012207031));
      auVar97 = vshufps_avx(auVar53,auVar53,0);
      auVar53 = ZEXT416((uint)((float)patch->v[3] * 0.00012207031));
      auVar107 = vshufps_avx(auVar53,auVar53,0);
      auVar53 = ZEXT416((uint)((float)patch->v[1] * 0.00012207031));
      auVar126 = vshufps_avx(auVar53,auVar53,0);
      auVar53 = ZEXT416((uint)((float)patch->v[2] * 0.00012207031));
      auVar100 = vshufps_avx(auVar53,auVar53,0);
      lVar35 = 0;
      auVar101._8_4_ = 0x3f800000;
      auVar101._0_8_ = &DAT_3f8000003f800000;
      auVar101._12_4_ = 0x3f800000;
      auVar101._16_4_ = 0x3f800000;
      auVar101._20_4_ = 0x3f800000;
      auVar101._24_4_ = 0x3f800000;
      auVar101._28_4_ = 0x3f800000;
      do {
        auVar10 = *(undefined1 (*) [32])((long)grid_u + lVar35);
        auVar59 = *(undefined1 (*) [32])((long)grid_v + lVar35);
        auVar61 = vsubps_avx(auVar101,auVar10);
        auVar62 = vsubps_avx(auVar101,auVar59);
        fVar76 = auVar59._0_4_;
        fVar77 = auVar59._4_4_;
        fVar78 = auVar59._8_4_;
        fVar79 = auVar59._12_4_;
        fVar80 = auVar59._16_4_;
        fVar81 = auVar59._20_4_;
        fVar88 = auVar59._24_4_;
        fVar91 = auVar62._0_4_;
        fVar92 = auVar62._4_4_;
        fVar93 = auVar62._8_4_;
        fVar94 = auVar62._12_4_;
        fVar95 = auVar62._16_4_;
        fVar96 = auVar62._20_4_;
        fVar124 = auVar62._24_4_;
        fVar73 = in_ZMM15._28_4_;
        auVar129._0_4_ =
             auVar61._0_4_ * (fVar76 * auVar99._0_4_ + fVar91 * auVar54._0_4_) +
             auVar10._0_4_ * (fVar76 * auVar120._0_4_ + fVar91 * auVar110._0_4_);
        auVar129._4_4_ =
             auVar61._4_4_ * (fVar77 * auVar99._4_4_ + fVar92 * auVar54._4_4_) +
             auVar10._4_4_ * (fVar77 * auVar120._4_4_ + fVar92 * auVar110._4_4_);
        auVar129._8_4_ =
             auVar61._8_4_ * (fVar78 * auVar99._8_4_ + fVar93 * auVar54._8_4_) +
             auVar10._8_4_ * (fVar78 * auVar120._8_4_ + fVar93 * auVar110._8_4_);
        auVar129._12_4_ =
             auVar61._12_4_ * (fVar79 * auVar99._12_4_ + fVar94 * auVar54._12_4_) +
             auVar10._12_4_ * (fVar79 * auVar120._12_4_ + fVar94 * auVar110._12_4_);
        auVar129._16_4_ =
             auVar61._16_4_ * (fVar80 * auVar99._0_4_ + fVar95 * auVar54._0_4_) +
             auVar10._16_4_ * (fVar80 * auVar120._0_4_ + fVar95 * auVar110._0_4_);
        auVar129._20_4_ =
             auVar61._20_4_ * (fVar81 * auVar99._4_4_ + fVar96 * auVar54._4_4_) +
             auVar10._20_4_ * (fVar81 * auVar120._4_4_ + fVar96 * auVar110._4_4_);
        auVar129._24_4_ =
             auVar61._24_4_ * (fVar88 * auVar99._8_4_ + fVar124 * auVar54._8_4_) +
             auVar10._24_4_ * (fVar88 * auVar120._8_4_ + fVar124 * auVar110._8_4_);
        auVar129._28_4_ = in_ZMM13._28_4_ + in_register_0000159c + in_register_0000159c + fVar73;
        in_ZMM13 = ZEXT3264(auVar129);
        fVar130 = fVar91 * auVar97._0_4_;
        fVar131 = fVar92 * auVar97._4_4_;
        fVar132 = fVar93 * auVar97._8_4_;
        fVar133 = fVar94 * auVar97._12_4_;
        fVar134 = fVar95 * auVar97._0_4_;
        fVar68 = fVar96 * auVar97._4_4_;
        fVar69 = fVar124 * auVar97._8_4_;
        in_ZMM15 = ZEXT3264(CONCAT428(fVar73,CONCAT424(fVar69,CONCAT420(fVar68,CONCAT416(fVar134,
                                                  CONCAT412(fVar133,CONCAT48(fVar132,CONCAT44(
                                                  fVar131,fVar130))))))));
        in_register_0000159c = in_register_0000159c + fVar73 + fVar73;
        auVar53._0_4_ = auVar61._0_4_ * (fVar76 * auVar107._0_4_ + fVar130);
        auVar53._4_4_ = auVar61._4_4_ * (fVar77 * auVar107._4_4_ + fVar131);
        auVar53._8_4_ = auVar61._8_4_ * (fVar78 * auVar107._8_4_ + fVar132);
        auVar53._12_4_ = auVar61._12_4_ * (fVar79 * auVar107._12_4_ + fVar133);
        *(undefined1 (*) [32])((long)grid_u + lVar35) = auVar129;
        pfVar37 = (float *)((long)grid_v + lVar35);
        *pfVar37 = auVar53._0_4_ +
                   auVar10._0_4_ * (fVar76 * auVar100._0_4_ + fVar91 * auVar126._0_4_);
        pfVar37[1] = auVar53._4_4_ +
                     auVar10._4_4_ * (fVar77 * auVar100._4_4_ + fVar92 * auVar126._4_4_);
        pfVar37[2] = auVar53._8_4_ +
                     auVar10._8_4_ * (fVar78 * auVar100._8_4_ + fVar93 * auVar126._8_4_);
        pfVar37[3] = auVar53._12_4_ +
                     auVar10._12_4_ * (fVar79 * auVar100._12_4_ + fVar94 * auVar126._12_4_);
        pfVar37[4] = auVar61._16_4_ * (fVar80 * auVar107._0_4_ + fVar134) +
                     auVar10._16_4_ * (fVar80 * auVar100._0_4_ + fVar95 * auVar126._0_4_);
        pfVar37[5] = auVar61._20_4_ * (fVar81 * auVar107._4_4_ + fVar68) +
                     auVar10._20_4_ * (fVar81 * auVar100._4_4_ + fVar96 * auVar126._4_4_);
        pfVar37[6] = auVar61._24_4_ * (fVar88 * auVar107._8_4_ + fVar69) +
                     auVar10._24_4_ * (fVar88 * auVar100._8_4_ + fVar124 * auVar126._8_4_);
        pfVar37[7] = auVar59._28_4_ + auVar62._28_4_ + auVar10._28_4_;
        lVar35 = lVar35 + 0x20;
      } while ((ulong)(uVar48 + (uVar48 == 0)) << 5 != lVar35);
    }
    pcVar9 = *(code **)&(geom->super_Geometry).field_0x58;
    if (pcVar9 != (code *)0x0) {
      local_2d40._0_8_ = (geom->super_Geometry).userPtr;
      uStack_2d30 = patch->prim;
      uStack_2d2c = patch->time_;
      pfStack_2d28 = grid_u;
      local_2d20 = grid_v;
      paStack_2d18 = local_2d80;
      paStack_2d10 = local_3dc0;
      paStack_2d08 = local_c0;
      local_2d00._0_8_ = grid_x;
      local_2d00._8_8_ = grid_y;
      pfStack_2cf0 = grid_z;
      local_2d40._8_8_ = geom;
      uStack_2ce8 = uVar24;
      (*pcVar9)();
    }
    auVar10 = _DAT_02028040;
    auVar101 = _DAT_02021e40;
    if (uVar24 < (uVar43 & 0xfffffff8)) {
      uVar24 = uVar24 - 1;
      lVar35 = (uVar43 & 0xfffffff8) - uVar26;
      auVar54._8_8_ = 0;
      auVar54._0_8_ = lVar35 - 1;
      auVar54 = vpshufd_avx(auVar54,0x44);
      fVar73 = grid_u[uVar24];
      auVar59._4_4_ = fVar73;
      auVar59._0_4_ = fVar73;
      auVar59._8_4_ = fVar73;
      auVar59._12_4_ = fVar73;
      auVar59._16_4_ = fVar73;
      auVar59._20_4_ = fVar73;
      auVar59._24_4_ = fVar73;
      auVar59._28_4_ = fVar73;
      fVar73 = grid_v[uVar24];
      auVar61._4_4_ = fVar73;
      auVar61._0_4_ = fVar73;
      auVar61._8_4_ = fVar73;
      auVar61._12_4_ = fVar73;
      auVar61._16_4_ = fVar73;
      auVar61._20_4_ = fVar73;
      auVar61._24_4_ = fVar73;
      auVar61._28_4_ = fVar73;
      fVar73 = grid_x[uVar24];
      auVar62._4_4_ = fVar73;
      auVar62._0_4_ = fVar73;
      auVar62._8_4_ = fVar73;
      auVar62._12_4_ = fVar73;
      auVar62._16_4_ = fVar73;
      auVar62._20_4_ = fVar73;
      auVar62._24_4_ = fVar73;
      auVar62._28_4_ = fVar73;
      fVar73 = grid_y[uVar24];
      auVar67._4_4_ = fVar73;
      auVar67._0_4_ = fVar73;
      auVar67._8_4_ = fVar73;
      auVar67._12_4_ = fVar73;
      auVar67._16_4_ = fVar73;
      auVar67._20_4_ = fVar73;
      auVar67._24_4_ = fVar73;
      auVar67._28_4_ = fVar73;
      fVar73 = grid_z[uVar24];
      auVar75._4_4_ = fVar73;
      auVar75._0_4_ = fVar73;
      auVar75._8_4_ = fVar73;
      auVar75._12_4_ = fVar73;
      auVar75._16_4_ = fVar73;
      auVar75._20_4_ = fVar73;
      auVar75._24_4_ = fVar73;
      auVar75._28_4_ = fVar73;
      uVar42 = 0;
      uVar46 = auVar54._0_8_;
      auVar99._0_8_ = uVar46 ^ 0x8000000000000000;
      auVar99._8_4_ = auVar54._8_4_;
      uVar41 = auVar54._12_4_;
      auVar99._12_4_ = uVar41 ^ 0x80000000;
      auVar110._0_8_ = uVar46 ^ 0x8000000000000000;
      auVar110._8_4_ = auVar99._8_4_;
      auVar110._12_4_ = uVar41 ^ 0x80000000;
      auVar53 = vpcmpeqd_avx(auVar53,auVar53);
      auVar120._0_8_ = uVar46 ^ 0x8000000000000000;
      auVar120._8_4_ = auVar99._8_4_;
      auVar120._12_4_ = uVar41 ^ 0x80000000;
      do {
        auVar97._8_8_ = 0;
        auVar97._0_8_ = uVar42;
        auVar54 = vpshufd_avx(auVar97,0x44);
        auVar122._16_16_ = auVar54;
        auVar122._0_16_ = auVar54;
        auVar129 = vorps_avx(auVar122,auVar101);
        auVar122 = vorps_avx(auVar122,auVar10);
        auVar100._0_8_ = auVar122._16_8_ ^ 0x8000000000000000;
        auVar100._8_4_ = auVar122._24_4_;
        auVar100._12_4_ = auVar122._28_4_ ^ 0x80000000;
        auVar54 = vpcmpgtq_avx(auVar100,auVar99);
        auVar107._0_8_ = auVar122._0_8_ ^ 0x8000000000000000;
        auVar107._8_4_ = auVar122._8_4_;
        auVar107._12_4_ = auVar122._12_4_ ^ 0x80000000;
        auVar97 = vpcmpgtq_avx(auVar107,auVar110);
        auVar54 = vpackssdw_avx(auVar97,auVar54);
        auVar125._0_8_ = auVar129._16_8_ ^ 0x8000000000000000;
        auVar125._8_4_ = auVar129._24_4_;
        auVar125._12_4_ = auVar129._28_4_ ^ 0x80000000;
        auVar97 = vpcmpgtq_avx(auVar125,auVar99);
        auVar126._0_8_ = auVar129._0_8_ ^ 0x8000000000000000;
        auVar126._8_4_ = auVar129._8_4_;
        auVar126._12_4_ = auVar129._12_4_ ^ 0x80000000;
        auVar107 = vpcmpgtq_avx(auVar126,auVar120);
        auVar97 = vpackssdw_avx(auVar107,auVar97);
        auVar54 = vpackssdw_avx(auVar97 ^ auVar53,auVar54 ^ auVar53);
        auVar97 = vpmovsxwd_avx(auVar54);
        auVar54 = vpunpckhwd_avx(auVar54,auVar54);
        auVar123._16_16_ = auVar54;
        auVar123._0_16_ = auVar97;
        auVar129 = vmaskmovps_avx(auVar123,auVar59);
        *(undefined1 (*) [32])(grid_u + uVar26 + uVar42) = auVar129;
        auVar129 = vmaskmovps_avx(auVar123,auVar61);
        *(undefined1 (*) [32])(grid_v + uVar26 + uVar42) = auVar129;
        auVar129 = vmaskmovps_avx(auVar123,auVar62);
        *(undefined1 (*) [32])(grid_x + uVar26 + uVar42) = auVar129;
        auVar129 = vmaskmovps_avx(auVar123,auVar67);
        *(undefined1 (*) [32])(grid_y + uVar26 + uVar42) = auVar129;
        auVar129 = vmaskmovps_avx(auVar123,auVar75);
        *(undefined1 (*) [32])(grid_z + uVar26 + uVar42) = auVar129;
        uVar42 = uVar42 + 8;
      } while ((lVar35 + 7U & 0xfffffffffffffff8) != uVar42);
    }
    if (local_c0 != local_10c0) {
      alignedFree(local_c0);
    }
    if (local_3dc0 != &local_4dc0) {
      alignedFree(local_3dc0);
    }
    if (local_2d80 != &local_3d80) {
      alignedFree(local_2d80);
    }
  }
  else {
    if (uVar41 != 0) {
      auVar53 = vpshufd_avx(ZEXT416(swidth),0);
      auVar110 = vpcmpeqd_avx(ZEXT416(swidth),ZEXT416(swidth));
      auVar54 = vpaddd_avx(auVar53,auVar110);
      auVar53 = vpshufd_avx(ZEXT416(sheight),0);
      auVar99 = vpaddd_avx(auVar53,auVar110);
      auVar64._16_16_ = auVar54;
      auVar64._0_16_ = auVar54;
      auVar101 = vcvtdq2ps_avx(auVar64);
      auVar10 = vrcpps_avx(auVar101);
      fVar73 = auVar10._0_4_;
      auVar106._0_4_ = fVar73 * auVar101._0_4_;
      fVar76 = auVar10._4_4_;
      auVar106._4_4_ = fVar76 * auVar101._4_4_;
      fVar77 = auVar10._8_4_;
      auVar106._8_4_ = fVar77 * auVar101._8_4_;
      fVar78 = auVar10._12_4_;
      auVar106._12_4_ = fVar78 * auVar101._12_4_;
      fVar79 = auVar10._16_4_;
      auVar106._16_4_ = fVar79 * auVar101._16_4_;
      fVar80 = auVar10._20_4_;
      auVar106._20_4_ = fVar80 * auVar101._20_4_;
      fVar81 = auVar10._24_4_;
      auVar106._28_36_ = in_ZMM5._28_36_;
      auVar106._24_4_ = fVar81 * auVar101._24_4_;
      auVar65._8_4_ = 0x3f800000;
      auVar65._0_8_ = &DAT_3f8000003f800000;
      auVar65._12_4_ = 0x3f800000;
      auVar65._16_4_ = 0x3f800000;
      auVar65._20_4_ = 0x3f800000;
      auVar65._24_4_ = 0x3f800000;
      auVar65._28_4_ = 0x3f800000;
      in_ZMM3 = ZEXT3264(auVar65);
      auVar61 = vsubps_avx(auVar65,auVar106._0_32_);
      auVar87._16_16_ = auVar99;
      auVar87._0_16_ = auVar99;
      auVar101 = vcvtdq2ps_avx(auVar87);
      auVar59 = vrcpps_avx(auVar101);
      fVar73 = fVar73 + fVar73 * auVar61._0_4_;
      fVar76 = fVar76 + fVar76 * auVar61._4_4_;
      fVar77 = fVar77 + fVar77 * auVar61._8_4_;
      fVar78 = fVar78 + fVar78 * auVar61._12_4_;
      fVar79 = fVar79 + fVar79 * auVar61._16_4_;
      fVar80 = fVar80 + fVar80 * auVar61._20_4_;
      fVar81 = fVar81 + fVar81 * auVar61._24_4_;
      in_ZMM4 = ZEXT3264(CONCAT428(auVar10._28_4_ + auVar61._28_4_,
                                   CONCAT424(fVar81,CONCAT420(fVar80,CONCAT416(fVar79,CONCAT412(
                                                  fVar78,CONCAT48(fVar77,CONCAT44(fVar76,fVar73)))))
                                            )));
      fVar88 = auVar59._0_4_;
      fVar91 = auVar59._4_4_;
      auVar10._4_4_ = fVar91 * auVar101._4_4_;
      auVar10._0_4_ = fVar88 * auVar101._0_4_;
      fVar92 = auVar59._8_4_;
      auVar10._8_4_ = fVar92 * auVar101._8_4_;
      fVar93 = auVar59._12_4_;
      auVar10._12_4_ = fVar93 * auVar101._12_4_;
      fVar94 = auVar59._16_4_;
      auVar10._16_4_ = fVar94 * auVar101._16_4_;
      fVar95 = auVar59._20_4_;
      auVar10._20_4_ = fVar95 * auVar101._20_4_;
      fVar96 = auVar59._24_4_;
      auVar10._24_4_ = fVar96 * auVar101._24_4_;
      auVar10._28_4_ = auVar61._28_4_;
      auVar101 = vsubps_avx(auVar65,auVar10);
      auVar120 = vpshufd_avx(ZEXT416(x0),0);
      auVar53 = vpshufd_avx(ZEXT416(y0),0);
      auVar106 = ZEXT1664((undefined1  [16])0x0);
      lVar35 = 0;
      auVar114._8_4_ = 8;
      auVar114._0_8_ = 0x800000008;
      auVar114._12_4_ = 8;
      iVar31 = 0;
      do {
        auVar97 = auVar106._0_16_;
        auVar107 = auVar106._16_16_;
        if (dwidth != 0) {
          auVar126 = vpcmpgtd_avx(auVar99,auVar97);
          auVar126 = vpackssdw_avx(auVar126,auVar126);
          auVar100 = vpcmpgtd_avx(auVar99,auVar107);
          auVar126 = vpunpcklwd_avx(auVar126,auVar126);
          auVar121._16_16_ = auVar100;
          auVar121._0_16_ = auVar126;
          auVar126 = vpaddd_avx(auVar97,auVar53);
          auVar100 = vpaddd_avx(auVar107,auVar53);
          auVar127._16_16_ = auVar100;
          auVar127._0_16_ = auVar126;
          auVar10 = vcvtdq2ps_avx(auVar127);
          auVar11._4_4_ = auVar10._4_4_ * (fVar91 + fVar91 * auVar101._4_4_);
          auVar11._0_4_ = auVar10._0_4_ * (fVar88 + fVar88 * auVar101._0_4_);
          auVar11._8_4_ = auVar10._8_4_ * (fVar92 + fVar92 * auVar101._8_4_);
          auVar11._12_4_ = auVar10._12_4_ * (fVar93 + fVar93 * auVar101._12_4_);
          auVar11._16_4_ = auVar10._16_4_ * (fVar94 + fVar94 * auVar101._16_4_);
          auVar11._20_4_ = auVar10._20_4_ * (fVar95 + fVar95 * auVar101._20_4_);
          auVar11._24_4_ = auVar10._24_4_ * (fVar96 + fVar96 * auVar101._24_4_);
          auVar11._28_4_ = auVar10._28_4_;
          auVar10 = vblendvps_avx(auVar65,auVar11,auVar121);
          uVar46 = 0;
          auVar128 = _DAT_0205a920;
          do {
            auVar125 = auVar128._0_16_;
            auVar126 = vpcmpgtd_avx(auVar54,auVar125);
            auVar126 = vpackssdw_avx(auVar126,auVar126);
            auVar51 = auVar128._16_16_;
            auVar100 = vpcmpgtd_avx(auVar54,auVar51);
            auVar126 = vpunpcklwd_avx(auVar126,auVar126);
            auVar111._16_16_ = auVar100;
            auVar111._0_16_ = auVar126;
            auVar126 = vpaddd_avx(auVar125,auVar120);
            auVar100 = vpaddd_avx(auVar51,auVar120);
            auVar85._16_16_ = auVar100;
            auVar85._0_16_ = auVar126;
            auVar59 = vcvtdq2ps_avx(auVar85);
            auVar12._4_4_ = fVar76 * auVar59._4_4_;
            auVar12._0_4_ = fVar73 * auVar59._0_4_;
            auVar12._8_4_ = fVar77 * auVar59._8_4_;
            auVar12._12_4_ = fVar78 * auVar59._12_4_;
            auVar12._16_4_ = fVar79 * auVar59._16_4_;
            auVar12._20_4_ = fVar80 * auVar59._20_4_;
            auVar12._24_4_ = fVar81 * auVar59._24_4_;
            auVar12._28_4_ = auVar59._28_4_;
            auVar59 = vblendvps_avx(auVar65,auVar12,auVar111);
            uVar41 = (int)lVar35 + (int)uVar46;
            *(undefined1 (*) [32])(grid_u + uVar41) = auVar59;
            *(undefined1 (*) [32])(grid_v + uVar41) = auVar10;
            uVar46 = uVar46 + 8;
            auVar126 = vpaddd_avx(auVar51,auVar114);
            auVar100 = vpaddd_avx(auVar125,auVar114);
            auVar128._16_16_ = auVar126;
            auVar128._0_16_ = auVar100;
          } while (uVar46 < dwidth);
        }
        auVar107 = vpsubd_avx(auVar107,auVar110);
        auVar97 = vpsubd_avx(auVar97,auVar110);
        auVar106 = ZEXT3264(CONCAT1616(auVar107,auVar97));
        lVar35 = lVar35 + (ulong)dwidth;
        bVar50 = iVar31 != iVar38;
        iVar31 = iVar31 + 1;
      } while (bVar50);
    }
    auVar10 = _DAT_02028040;
    auVar101 = _DAT_02021e40;
    if (uVar24 < (uVar43 & 0xfffffff8)) {
      lVar35 = (uVar43 & 0xfffffff8) - uVar26;
      auVar51._8_8_ = 0;
      auVar51._0_8_ = lVar35 - 1;
      auVar54 = vpshufd_avx(auVar51,0x44);
      fVar73 = grid_u[uVar24 - 1];
      auVar58._4_4_ = fVar73;
      auVar58._0_4_ = fVar73;
      auVar58._8_4_ = fVar73;
      auVar58._12_4_ = fVar73;
      auVar58._16_4_ = fVar73;
      auVar58._20_4_ = fVar73;
      auVar58._24_4_ = fVar73;
      auVar58._28_4_ = fVar73;
      fVar73 = grid_v[uVar24 - 1];
      auVar60._4_4_ = fVar73;
      auVar60._0_4_ = fVar73;
      auVar60._8_4_ = fVar73;
      auVar60._12_4_ = fVar73;
      auVar60._16_4_ = fVar73;
      auVar60._20_4_ = fVar73;
      auVar60._24_4_ = fVar73;
      auVar60._28_4_ = fVar73;
      uVar42 = 0;
      in_ZMM3 = ZEXT3264(_DAT_02028040);
      in_ZMM4 = ZEXT1664(CONCAT88(0x8000000000000000,0x8000000000000000));
      uVar46 = auVar54._0_8_;
      auVar82._0_8_ = uVar46 ^ 0x8000000000000000;
      auVar82._8_4_ = auVar54._8_4_;
      uVar41 = auVar54._12_4_;
      auVar82._12_4_ = uVar41 ^ 0x80000000;
      auVar86._0_8_ = uVar46 ^ 0x8000000000000000;
      auVar86._8_4_ = auVar82._8_4_;
      auVar86._12_4_ = uVar41 ^ 0x80000000;
      auVar53 = vpcmpeqd_avx(auVar53,auVar53);
      auVar98._0_8_ = uVar46 ^ 0x8000000000000000;
      auVar98._8_4_ = auVar82._8_4_;
      auVar98._12_4_ = uVar41 ^ 0x80000000;
      do {
        auVar108._8_8_ = 0;
        auVar108._0_8_ = uVar42;
        auVar54 = vpshufd_avx(auVar108,0x44);
        auVar112._16_16_ = auVar54;
        auVar112._0_16_ = auVar54;
        auVar59 = vorps_avx(auVar112,auVar101);
        auVar61 = vorps_avx(auVar112,auVar10);
        auVar118._0_8_ = auVar61._16_8_ ^ 0x8000000000000000;
        auVar118._8_4_ = auVar61._24_4_;
        auVar118._12_4_ = auVar61._28_4_ ^ 0x80000000;
        auVar54 = vpcmpgtq_avx(auVar118,auVar82);
        auVar109._0_8_ = auVar61._0_8_ ^ 0x8000000000000000;
        auVar109._8_4_ = auVar61._8_4_;
        auVar109._12_4_ = auVar61._12_4_ ^ 0x80000000;
        auVar99 = vpcmpgtq_avx(auVar109,auVar86);
        auVar54 = vpackssdw_avx(auVar99,auVar54);
        auVar119._0_8_ = auVar59._16_8_ ^ 0x8000000000000000;
        auVar119._8_4_ = auVar59._24_4_;
        auVar119._12_4_ = auVar59._28_4_ ^ 0x80000000;
        auVar99 = vpcmpgtq_avx(auVar119,auVar82);
        auVar115._0_8_ = auVar59._0_8_ ^ 0x8000000000000000;
        auVar115._8_4_ = auVar59._8_4_;
        auVar115._12_4_ = auVar59._12_4_ ^ 0x80000000;
        auVar110 = vpcmpgtq_avx(auVar115,auVar98);
        auVar99 = vpackssdw_avx(auVar110,auVar99);
        auVar54 = vpackssdw_avx(auVar99 ^ auVar53,auVar54 ^ auVar53);
        auVar99 = vpmovsxwd_avx(auVar54);
        auVar54 = vpunpckhwd_avx(auVar54,auVar54);
        auVar113._16_16_ = auVar54;
        auVar113._0_16_ = auVar99;
        auVar59 = vmaskmovps_avx(auVar113,auVar58);
        *(undefined1 (*) [32])(grid_u + uVar26 + uVar42) = auVar59;
        auVar59 = vmaskmovps_avx(auVar113,auVar60);
        *(undefined1 (*) [32])(grid_v + uVar26 + uVar42) = auVar59;
        uVar42 = uVar42 + 8;
      } while ((lVar35 + 7U & 0xfffffffffffffff8) != uVar42);
    }
    auVar101 = _DAT_0205a920;
    if ((patch->flags & 0x10) != 0) {
      fVar73 = patch->level[1];
      uVar30 = x1 + 1;
      fVar76 = patch->level[2];
      uVar41 = (uint)(long)patch->level[0];
      uVar24 = (uint)(long)fVar76;
      fVar77 = patch->level[3];
      if (uVar41 + 1 < swidth && y0 == 0) {
        if (x0 <= x1) {
          auVar55._0_4_ = (float)((long)patch->level[0] & 0xffffffff);
          auVar55._4_8_ = SUB128(ZEXT812(0),4);
          auVar55._12_4_ = 0;
          auVar53 = vrcpss_avx(auVar55,auVar55);
          iVar31 = swidth * 2 + -2;
          uVar34 = x0 + 1;
          if (x0 + 1 < uVar30) {
            uVar34 = uVar30;
          }
          auVar99 = vpshufd_avx(ZEXT416(x0),0);
          auVar54 = vpaddd_avx(auVar99,_DAT_01ff0cf0);
          auVar99 = vpaddd_avx(auVar99,_DAT_02020ea0);
          auVar110 = vpshufd_avx(ZEXT416((uVar34 - x0) - 1),0);
          auVar120 = vpshufd_avx(ZEXT416(uVar41),0);
          auVar53 = ZEXT416((uint)(auVar53._0_4_ * (2.0 - auVar53._0_4_ * auVar55._0_4_)));
          auVar53 = vshufps_avx(auVar53,auVar53,0);
          in_ZMM3 = ZEXT3264(CONCAT1616(auVar53,auVar53));
          lVar35 = 0;
          in_ZMM4 = ZEXT3264(_DAT_0205a920);
          auVar83._8_4_ = 1;
          auVar83._0_8_ = 0x100000001;
          auVar83._12_4_ = 1;
          auVar89._8_4_ = 8;
          auVar89._0_8_ = 0x800000008;
          auVar89._12_4_ = 8;
          do {
            auVar97 = vpshufd_avx(ZEXT416((uint)lVar35),0);
            auVar102._16_16_ = auVar97;
            auVar102._0_16_ = auVar97;
            auVar10 = vorps_avx(auVar102,auVar101);
            auVar100 = auVar10._0_16_;
            auVar97 = vpminud_avx(auVar100,auVar110);
            auVar126 = vpcmpeqd_avx(auVar100,auVar97);
            auVar116 = ZEXT1632(auVar126);
            auVar97 = vpaddd_avx(auVar54,auVar54);
            auVar107 = vpaddd_avx(auVar99,auVar99);
            auVar107 = vpor_avx(auVar107,auVar83);
            auVar107 = vpmulld_avx(auVar107,auVar120);
            auVar97 = vpor_avx(auVar97,auVar83);
            auVar97 = vpmulld_avx(auVar97,auVar120);
            if ((auVar126 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
              auVar116 = ZEXT432((uint)(auVar97._0_4_ / iVar31));
            }
            auVar126 = vpminud_avx(auVar100,auVar110);
            auVar126 = vpcmpeqd_avx(auVar100,auVar126);
            if ((auVar126 >> 0x20 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
              auVar126 = vpinsrd_avx(auVar116._0_16_,auVar97._4_4_ / iVar31,1);
              auVar116 = vblendps_avx(auVar116,ZEXT1632(auVar126),0xf);
            }
            auVar126 = vpminud_avx(auVar100,auVar110);
            auVar126 = vpcmpeqd_avx(auVar100,auVar126);
            if ((auVar126 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
              auVar126 = vpinsrd_avx(auVar116._0_16_,auVar97._8_4_ / iVar31,2);
              auVar116 = vblendps_avx(auVar116,ZEXT1632(auVar126),0xf);
            }
            auVar126 = vpminud_avx(auVar100,auVar110);
            auVar126 = vpcmpeqd_avx(auVar100,auVar126);
            if ((auVar126 >> 0x20 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
              auVar97 = vpinsrd_avx(auVar116._0_16_,auVar97._12_4_ / iVar31,3);
              auVar116 = vblendps_avx(auVar116,ZEXT1632(auVar97),0xf);
            }
            auVar97 = vpminud_avx(auVar10._16_16_,auVar110);
            auVar97 = vpcmpeqd_avx(auVar10._16_16_,auVar97);
            if ((auVar97 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
              auVar126 = vpinsrd_avx(auVar116._16_16_,auVar107._0_4_ / iVar31,0);
              auVar116._16_16_ = auVar126;
            }
            if ((auVar97 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
              iVar25 = vextractps_avx(auVar107,1);
              auVar126 = vpinsrd_avx(auVar116._16_16_,iVar25 / iVar31,1);
              auVar116._16_16_ = auVar126;
            }
            if ((auVar97 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
              iVar25 = vextractps_avx(auVar107,2);
              auVar126 = vpinsrd_avx(auVar116._16_16_,iVar25 / iVar31,2);
              auVar116._16_16_ = auVar126;
            }
            if ((auVar97 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
              iVar25 = vextractps_avx(auVar107,3);
              auVar107 = vpinsrd_avx(auVar116._16_16_,iVar25 / iVar31,3);
              auVar116._16_16_ = auVar107;
            }
            auVar107 = vpminud_avx(auVar100,auVar110);
            auVar107 = vpcmpeqd_avx(auVar100,auVar107);
            auVar103._16_16_ = auVar97;
            auVar103._0_16_ = auVar107;
            auVar10 = vcvtdq2ps_avx(auVar116);
            auVar16._4_4_ = auVar10._4_4_ * auVar53._4_4_;
            auVar16._0_4_ = auVar10._0_4_ * auVar53._0_4_;
            auVar16._8_4_ = auVar10._8_4_ * auVar53._8_4_;
            auVar16._12_4_ = auVar10._12_4_ * auVar53._12_4_;
            auVar16._16_4_ = auVar10._16_4_ * auVar53._0_4_;
            auVar16._20_4_ = auVar10._20_4_ * auVar53._4_4_;
            auVar16._24_4_ = auVar10._24_4_ * auVar53._8_4_;
            auVar16._28_4_ = auVar10._28_4_;
            auVar10 = vmaskmovps_avx(auVar103,auVar16);
            *(undefined1 (*) [32])(grid_u + lVar35) = auVar10;
            auVar99 = vpaddd_avx(auVar99,auVar89);
            auVar54 = vpaddd_avx(auVar54,auVar89);
            lVar35 = lVar35 + 8;
          } while (((uVar34 - x0) + 7 & 0xfffffff8) != (uint)lVar35);
        }
        if (swidth - 1 == x1) {
          grid_u[uVar33] = 1.0;
        }
      }
      auVar101 = _DAT_0205a920;
      iVar31 = (int)(long)fVar73;
      if (uVar24 + 1 < swidth && y1 + 1 == sheight) {
        if (x0 <= x1) {
          auVar56._0_4_ = (float)((long)fVar76 & 0xffffffff);
          auVar56._4_8_ = SUB128(ZEXT812(0),4);
          auVar56._12_4_ = 0;
          auVar53 = vrcpss_avx(auVar56,auVar56);
          iVar25 = swidth * 2 + -2;
          uVar41 = x0 + 1;
          if (x0 + 1 < uVar30) {
            uVar41 = uVar30;
          }
          auVar99 = vpshufd_avx(ZEXT416(x0),0);
          auVar54 = vpaddd_avx(auVar99,_DAT_01ff0cf0);
          auVar99 = vpaddd_avx(auVar99,_DAT_02020ea0);
          auVar110 = vpshufd_avx(ZEXT416((uVar41 - x0) - 1),0);
          auVar120 = vpshufd_avx(ZEXT416(uVar24),0);
          auVar53 = ZEXT416((uint)(auVar53._0_4_ * (2.0 - auVar53._0_4_ * auVar56._0_4_)));
          auVar53 = vshufps_avx(auVar53,auVar53,0);
          in_ZMM3 = ZEXT3264(CONCAT1616(auVar53,auVar53));
          lVar35 = 0;
          in_ZMM4 = ZEXT3264(_DAT_0205a920);
          auVar84._8_4_ = 1;
          auVar84._0_8_ = 0x100000001;
          auVar84._12_4_ = 1;
          auVar90._8_4_ = 8;
          auVar90._0_8_ = 0x800000008;
          auVar90._12_4_ = 8;
          do {
            auVar97 = vpshufd_avx(ZEXT416((uint)lVar35),0);
            auVar104._16_16_ = auVar97;
            auVar104._0_16_ = auVar97;
            auVar10 = vorps_avx(auVar104,auVar101);
            auVar100 = auVar10._0_16_;
            auVar97 = vpminud_avx(auVar100,auVar110);
            auVar126 = vpcmpeqd_avx(auVar100,auVar97);
            auVar117 = ZEXT1632(auVar126);
            auVar97 = vpaddd_avx(auVar54,auVar54);
            auVar107 = vpaddd_avx(auVar99,auVar99);
            auVar107 = vpor_avx(auVar107,auVar84);
            auVar107 = vpmulld_avx(auVar107,auVar120);
            auVar97 = vpor_avx(auVar97,auVar84);
            auVar97 = vpmulld_avx(auVar97,auVar120);
            if ((auVar126 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
              auVar117 = ZEXT432((uint)(auVar97._0_4_ / iVar25));
            }
            auVar126 = vpminud_avx(auVar100,auVar110);
            auVar126 = vpcmpeqd_avx(auVar100,auVar126);
            if ((auVar126 >> 0x20 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
              auVar126 = vpinsrd_avx(auVar117._0_16_,auVar97._4_4_ / iVar25,1);
              auVar117 = vblendps_avx(auVar117,ZEXT1632(auVar126),0xf);
            }
            auVar126 = vpminud_avx(auVar100,auVar110);
            auVar126 = vpcmpeqd_avx(auVar100,auVar126);
            if ((auVar126 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
              auVar126 = vpinsrd_avx(auVar117._0_16_,auVar97._8_4_ / iVar25,2);
              auVar117 = vblendps_avx(auVar117,ZEXT1632(auVar126),0xf);
            }
            auVar126 = vpminud_avx(auVar100,auVar110);
            auVar126 = vpcmpeqd_avx(auVar100,auVar126);
            if ((auVar126 >> 0x20 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
              auVar97 = vpinsrd_avx(auVar117._0_16_,auVar97._12_4_ / iVar25,3);
              auVar117 = vblendps_avx(auVar117,ZEXT1632(auVar97),0xf);
            }
            auVar97 = vpminud_avx(auVar10._16_16_,auVar110);
            auVar97 = vpcmpeqd_avx(auVar10._16_16_,auVar97);
            if ((auVar97 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
              auVar126 = vpinsrd_avx(auVar117._16_16_,auVar107._0_4_ / iVar25,0);
              auVar117._16_16_ = auVar126;
            }
            if ((auVar97 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
              iVar32 = vextractps_avx(auVar107,1);
              auVar126 = vpinsrd_avx(auVar117._16_16_,iVar32 / iVar25,1);
              auVar117._16_16_ = auVar126;
            }
            if ((auVar97 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
              iVar32 = vextractps_avx(auVar107,2);
              auVar126 = vpinsrd_avx(auVar117._16_16_,iVar32 / iVar25,2);
              auVar117._16_16_ = auVar126;
            }
            if ((auVar97 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
              iVar32 = vextractps_avx(auVar107,3);
              auVar107 = vpinsrd_avx(auVar117._16_16_,iVar32 / iVar25,3);
              auVar117._16_16_ = auVar107;
            }
            auVar107 = vpminud_avx(auVar100,auVar110);
            auVar107 = vpcmpeqd_avx(auVar100,auVar107);
            auVar105._16_16_ = auVar97;
            auVar105._0_16_ = auVar107;
            auVar10 = vcvtdq2ps_avx(auVar117);
            auVar17._4_4_ = auVar10._4_4_ * auVar53._4_4_;
            auVar17._0_4_ = auVar10._0_4_ * auVar53._0_4_;
            auVar17._8_4_ = auVar10._8_4_ * auVar53._8_4_;
            auVar17._12_4_ = auVar10._12_4_ * auVar53._12_4_;
            auVar17._16_4_ = auVar10._16_4_ * auVar53._0_4_;
            auVar17._20_4_ = auVar10._20_4_ * auVar53._4_4_;
            auVar17._24_4_ = auVar10._24_4_ * auVar53._8_4_;
            auVar17._28_4_ = auVar10._28_4_;
            auVar10 = vmaskmovps_avx(auVar105,auVar17);
            *(undefined1 (*) [32])(grid_u + (ulong)(iVar38 * dwidth) + lVar35) = auVar10;
            auVar99 = vpaddd_avx(auVar99,auVar90);
            auVar54 = vpaddd_avx(auVar54,auVar90);
            lVar35 = lVar35 + 8;
          } while (((uVar41 - x0) + 7 & 0xfffffff8) != (uint)lVar35);
        }
        if (swidth - 1 == x1) {
          grid_u[(ulong)(iVar38 * dwidth) + (ulong)uVar33] = 1.0;
        }
      }
      iVar25 = (int)(long)fVar77;
      if (iVar31 + 1U < sheight && x0 == 0) {
        if (y0 <= y1) {
          auVar57._0_4_ = (float)((long)fVar73 & 0xffffffff);
          auVar57._4_8_ = SUB128(ZEXT812(0),4);
          auVar57._12_4_ = 0;
          auVar53 = vrcpss_avx(auVar57,auVar57);
          iVar32 = (y0 * 2 + 1) * iVar31;
          uVar26 = 0;
          uVar41 = y0;
          do {
            in_ZMM3 = ZEXT1264(ZEXT812(0));
            grid_v[uVar33 + uVar26] =
                 auVar53._0_4_ * (2.0 - auVar53._0_4_ * auVar57._0_4_) *
                 (float)(iVar32 / (int)(sheight * 2 + -2));
            uVar41 = uVar41 + 1;
            uVar26 = (ulong)((int)uVar26 + dwidth);
            iVar32 = iVar32 + iVar31 * 2;
          } while (uVar41 <= y1);
        }
        if (sheight - 1 == y1) {
          grid_v[(ulong)uVar33 + (ulong)(iVar38 * dwidth)] = 1.0;
        }
      }
      if (iVar25 + 1U < sheight && uVar30 == swidth) {
        if (y0 <= y1) {
          auVar52._0_4_ = (float)((long)fVar77 & 0xffffffff);
          auVar52._4_8_ = SUB128(ZEXT812(0),4);
          auVar52._12_4_ = 0;
          auVar53 = vrcpss_avx(auVar52,auVar52);
          iVar31 = (y0 * 2 + 1) * iVar25;
          uVar26 = 0;
          do {
            in_ZMM3 = ZEXT1264(ZEXT812(0));
            grid_v[uVar26] =
                 auVar53._0_4_ * (2.0 - auVar53._0_4_ * auVar52._0_4_) *
                 (float)(iVar31 / (int)(sheight * 2 + -2));
            y0 = y0 + 1;
            uVar26 = (ulong)((int)uVar26 + dwidth);
            iVar31 = iVar31 + iVar25 * 2;
          } while (y0 <= y1);
        }
        if (sheight - 1 == y1) {
          grid_v[iVar38 * dwidth] = 1.0;
        }
      }
    }
    if (7 < uVar43) {
      lVar35 = 0;
      do {
        puVar2 = (undefined8 *)((long)grid_u + lVar35);
        local_10c0[0]._0_8_ = *puVar2;
        local_10c0[0]._8_8_ = puVar2[1];
        local_10c0[0]._16_8_ = puVar2[2];
        local_10c0[0]._24_8_ = puVar2[3];
        puVar2 = (undefined8 *)((long)grid_v + lVar35);
        local_4de0._0_8_ = *puVar2;
        local_4de0._8_8_ = puVar2[1];
        local_4de0._16_8_ = puVar2[2];
        local_4de0._24_8_ = puVar2[3];
        in_ZMM3 = ZEXT1664(in_ZMM3._0_16_);
        in_ZMM4 = ZEXT1664(in_ZMM4._0_16_);
        patchEval<embree::vfloat_impl<8>>
                  (patch,(vfloat_impl<8> *)local_10c0,(vfloat_impl<8> *)&local_4de0);
        fVar76 = in_ZMM4._28_4_;
        fVar73 = in_ZMM3._28_4_;
        if (*(long *)&(geom->super_Geometry).field_0x58 != 0) {
          patchNormal<embree::vfloat_impl<8>>
                    (patch,(vfloat_impl<8> *)local_10c0,(vfloat_impl<8> *)&local_4de0);
          auVar20._8_8_ = local_4dc0._8_8_;
          auVar20._0_8_ = local_4dc0._0_8_;
          auVar20._16_4_ = local_4dc0.i[4];
          auVar20._20_4_ = local_4dc0.i[5];
          auVar20._24_8_ = local_4dc0._24_8_;
          auVar21._8_8_ = paStack_4d98;
          auVar21._0_8_ = local_4da0;
          auVar21._16_8_ = puStack_4d90;
          auVar21._24_8_ = pauStack_4d88;
          auVar22._8_8_ = ppfStack_4d78;
          auVar22._0_8_ = local_4d80;
          auVar22._16_8_ = paStack_4d70;
          auVar22._24_4_ = fStack_4d68;
          auVar22._28_4_ = uStack_4d64;
          fVar77 = SUB84(local_4d80,0);
          fVar80 = (float)((ulong)local_4d80 >> 0x20);
          fVar91 = SUB84(ppfStack_4d78,0);
          fVar94 = (float)((ulong)ppfStack_4d78 >> 0x20);
          fVar124 = SUB84(paStack_4d70,0);
          fVar131 = (float)((ulong)paStack_4d70 >> 0x20);
          fVar78 = SUB84(local_4da0,0);
          fVar81 = (float)((ulong)local_4da0 >> 0x20);
          fVar92 = SUB84(paStack_4d98,0);
          fVar95 = (float)((ulong)paStack_4d98 >> 0x20);
          fVar130 = SUB84(puStack_4d90,0);
          fVar132 = (float)((ulong)puStack_4d90 >> 0x20);
          fVar133 = SUB84(pauStack_4d88,0);
          fVar79 = (float)local_4dc0._0_8_;
          fVar88 = (float)((ulong)local_4dc0._0_8_ >> 0x20);
          fVar93 = (float)local_4dc0._8_8_;
          fVar96 = (float)((ulong)local_4dc0._8_8_ >> 0x20);
          fVar134 = (float)local_4dc0._24_8_;
          auVar66._0_4_ = fVar79 * fVar79 + fVar77 * fVar77 + fVar78 * fVar78;
          auVar66._4_4_ = fVar88 * fVar88 + fVar80 * fVar80 + fVar81 * fVar81;
          auVar66._8_4_ = fVar93 * fVar93 + fVar91 * fVar91 + fVar92 * fVar92;
          auVar66._12_4_ = fVar96 * fVar96 + fVar94 * fVar94 + fVar95 * fVar95;
          auVar66._16_4_ = local_4dc0.v[4] * local_4dc0.v[4] + fVar124 * fVar124 + fVar130 * fVar130
          ;
          auVar66._20_4_ = local_4dc0.v[5] * local_4dc0.v[5] + fVar131 * fVar131 + fVar132 * fVar132
          ;
          auVar66._24_4_ = fVar134 * fVar134 + fStack_4d68 * fStack_4d68 + fVar133 * fVar133;
          auVar66._28_4_ = fVar76 + fVar73 + fVar76;
          auVar10 = vrsqrtps_avx(auVar66);
          auVar101 = vcmpps_avx(auVar66,_DAT_02020f00,0);
          fVar73 = auVar10._0_4_;
          fVar76 = auVar10._4_4_;
          fVar68 = auVar10._8_4_;
          fVar69 = auVar10._12_4_;
          fVar70 = auVar10._16_4_;
          fVar71 = auVar10._20_4_;
          fVar72 = auVar10._24_4_;
          fVar73 = fVar73 * 1.5 + fVar73 * fVar73 * fVar73 * auVar66._0_4_ * -0.5;
          fVar76 = fVar76 * 1.5 + fVar76 * fVar76 * fVar76 * auVar66._4_4_ * -0.5;
          fVar68 = fVar68 * 1.5 + fVar68 * fVar68 * fVar68 * auVar66._8_4_ * -0.5;
          fVar69 = fVar69 * 1.5 + fVar69 * fVar69 * fVar69 * auVar66._12_4_ * -0.5;
          fVar70 = fVar70 * 1.5 + fVar70 * fVar70 * fVar70 * auVar66._16_4_ * -0.5;
          fVar71 = fVar71 * 1.5 + fVar71 * fVar71 * fVar71 * auVar66._20_4_ * -0.5;
          fVar72 = fVar72 * 1.5 + fVar72 * fVar72 * fVar72 * auVar66._24_4_ * -0.5;
          auVar74._0_4_ = fVar79 * fVar73;
          auVar74._4_4_ = fVar88 * fVar76;
          auVar74._8_4_ = fVar93 * fVar68;
          auVar74._12_4_ = fVar96 * fVar69;
          auVar13._16_4_ = local_4dc0.v[4] * fVar70;
          auVar13._0_16_ = auVar74;
          auVar13._20_4_ = local_4dc0.v[5] * fVar71;
          auVar13._24_4_ = fVar134 * fVar72;
          auVar13._28_4_ = auVar10._28_4_;
          auVar14._4_4_ = fVar81 * fVar76;
          auVar14._0_4_ = fVar78 * fVar73;
          auVar14._8_4_ = fVar92 * fVar68;
          auVar14._12_4_ = fVar95 * fVar69;
          auVar14._16_4_ = fVar130 * fVar70;
          auVar14._20_4_ = fVar132 * fVar71;
          auVar14._24_4_ = fVar133 * fVar72;
          auVar14._28_4_ = 0x3fc00000;
          auVar63._0_4_ = fVar77 * fVar73;
          auVar63._4_4_ = fVar80 * fVar76;
          auVar63._8_4_ = fVar91 * fVar68;
          auVar63._12_4_ = fVar94 * fVar69;
          auVar15._16_4_ = fVar124 * fVar70;
          auVar15._0_16_ = auVar63;
          auVar15._20_4_ = fVar131 * fVar71;
          auVar15._24_4_ = fStack_4d68 * fVar72;
          auVar15._28_4_ = auVar66._28_4_ + 1.5;
          local_3d80 = (anon_union_32_3_4e90abd3_for_vfloat_impl<8>_1)
                       vblendvps_avx(auVar13,auVar20,auVar101);
          local_3d60 = vblendvps_avx(auVar14,auVar21,auVar101);
          local_3d40[0] = vblendvps_avx(auVar15,auVar22,auVar101);
          local_4dc0._0_8_ = (geom->super_Geometry).userPtr;
          local_4dc0._8_8_ = geom;
          local_4dc0.v[4] = (float)patch->prim;
          local_4dc0.v[5] = (float)patch->time_;
          local_4dc0._24_8_ = local_10c0;
          paStack_4d98 = &local_3d80;
          puStack_4d90 = local_3d60;
          pauStack_4d88 = local_3d40;
          local_4d80 = &local_2d40;
          ppfStack_4d78 = &local_2d20;
          paStack_4d70 = &local_2d00;
          fStack_4d68 = 1.12104e-44;
          in_ZMM3 = ZEXT1664(auVar63);
          in_ZMM4 = ZEXT1664(auVar74);
          local_4da0 = &local_4de0;
          (**(code **)&(geom->super_Geometry).field_0x58)(&local_4dc0);
        }
        puVar2 = (undefined8 *)((long)grid_x + lVar35);
        *puVar2 = local_2d40._0_8_;
        puVar2[1] = local_2d40._8_8_;
        puVar2[2] = CONCAT44(uStack_2d2c,uStack_2d30);
        puVar2[3] = pfStack_2d28;
        puVar2 = (undefined8 *)((long)grid_y + lVar35);
        *puVar2 = local_2d20;
        puVar2[1] = paStack_2d18;
        puVar2[2] = paStack_2d10;
        puVar2[3] = paStack_2d08;
        puVar2 = (undefined8 *)((long)grid_z + lVar35);
        *puVar2 = local_2d00._0_8_;
        puVar2[1] = local_2d00._8_8_;
        puVar2[2] = pfStack_2cf0;
        puVar2[3] = CONCAT44(uStack_2ce4,uStack_2ce8);
        lVar35 = lVar35 + 0x20;
      } while ((ulong)(uVar48 + (uVar48 == 0)) << 5 != lVar35);
    }
  }
  return;
}

Assistant:

void evalGrid(const SubdivPatch1Base& patch,
                  const unsigned x0, const unsigned x1,
                  const unsigned y0, const unsigned y1,
                  const unsigned swidth, const unsigned sheight,
                  float *__restrict__ const grid_x,
                  float *__restrict__ const grid_y,
                  float *__restrict__ const grid_z,
                  float *__restrict__ const grid_u,
                  float *__restrict__ const grid_v,
                  const SubdivMesh* const geom)
    {
      const unsigned dwidth  = x1-x0+1;
      const unsigned dheight = y1-y0+1;
      const unsigned M = dwidth*dheight+VSIZEX;
      const unsigned grid_size_simd_blocks = (M-1)/VSIZEX;

      if (unlikely(patch.type == SubdivPatch1Base::EVAL_PATCH))
      {
        const bool displ = geom->displFunc;
        const unsigned N = displ ? M : 0;
        dynamic_large_stack_array(float,grid_Ng_x,N,32*32*sizeof(float));
        dynamic_large_stack_array(float,grid_Ng_y,N,32*32*sizeof(float));
        dynamic_large_stack_array(float,grid_Ng_z,N,32*32*sizeof(float));
        
        if (geom->patch_eval_trees.size())
        {
          feature_adaptive_eval_grid<PatchEvalGrid> 
            (geom->patch_eval_trees[geom->numTimeSteps*patch.primID()+patch.time()], patch.subPatch(), patch.needsStitching() ? patch.level : nullptr,
             x0,x1,y0,y1,swidth,sheight,
             grid_x,grid_y,grid_z,grid_u,grid_v,
             displ ? (float*)grid_Ng_x : nullptr, displ ? (float*)grid_Ng_y : nullptr, displ ? (float*)grid_Ng_z : nullptr,
             dwidth,dheight);
        }
        else 
        {
          GeneralCatmullClarkPatch3fa ccpatch(patch.edge(),geom->getVertexBuffer(patch.time()));
          
          feature_adaptive_eval_grid<FeatureAdaptiveEvalGrid,GeneralCatmullClarkPatch3fa> 
            (ccpatch, patch.subPatch(), patch.needsStitching() ? patch.level : nullptr,
            x0,x1,y0,y1,swidth,sheight,
            grid_x,grid_y,grid_z,grid_u,grid_v,
            displ ? (float*)grid_Ng_x : nullptr, displ ? (float*)grid_Ng_y : nullptr, displ ? (float*)grid_Ng_z : nullptr,
            dwidth,dheight);
        }

        /* convert sub-patch UVs to patch UVs*/
        const Vec2f uv0 = patch.getUV(0);
        const Vec2f uv1 = patch.getUV(1);
        const Vec2f uv2 = patch.getUV(2);
        const Vec2f uv3 = patch.getUV(3);
        for (unsigned i=0; i<grid_size_simd_blocks; i++)
        {
          const vfloatx u = vfloatx::load(&grid_u[i*VSIZEX]);
          const vfloatx v = vfloatx::load(&grid_v[i*VSIZEX]);
          const vfloatx patch_u = lerp2(uv0.x,uv1.x,uv3.x,uv2.x,u,v);
          const vfloatx patch_v = lerp2(uv0.y,uv1.y,uv3.y,uv2.y,u,v);
          vfloatx::store(&grid_u[i*VSIZEX],patch_u);
          vfloatx::store(&grid_v[i*VSIZEX],patch_v);
        }

        /* call displacement shader */
        if (unlikely(geom->displFunc)) {
          RTCDisplacementFunctionNArguments args;
          args.geometryUserPtr = geom->userPtr;
          args.geometry = (RTCGeometry)geom;
          //args.geomID = patch.geomID();
          args.primID = patch.primID();
          args.timeStep = patch.time();
          args.u = grid_u;
          args.v = grid_v;
          args.Ng_x = grid_Ng_x;
          args.Ng_y = grid_Ng_y;
          args.Ng_z = grid_Ng_z;
          args.P_x = grid_x;
          args.P_y = grid_y;
          args.P_z = grid_z;
          args.N = dwidth*dheight;
          geom->displFunc(&args);
        }

        /* set last elements in u,v array to 1.0f */
        const float last_u = grid_u[dwidth*dheight-1];
        const float last_v = grid_v[dwidth*dheight-1];
        const float last_x = grid_x[dwidth*dheight-1];
        const float last_y = grid_y[dwidth*dheight-1];
        const float last_z = grid_z[dwidth*dheight-1];
        for (unsigned i=dwidth*dheight;i<grid_size_simd_blocks*VSIZEX;i++)
        {
          grid_u[i] = last_u;
          grid_v[i] = last_v;
          grid_x[i] = last_x;
          grid_y[i] = last_y;
          grid_z[i] = last_z;
        }
      }
      else
      {
        /* grid_u, grid_v need to be padded as we write with SIMD granularity */
        gridUVTessellator(patch.level,swidth,sheight,x0,y0,dwidth,dheight,grid_u,grid_v);
      
        /* set last elements in u,v array to last valid point */
        const float last_u = grid_u[dwidth*dheight-1];
        const float last_v = grid_v[dwidth*dheight-1];
        for (unsigned i=dwidth*dheight;i<grid_size_simd_blocks*VSIZEX;i++) {
          grid_u[i] = last_u;
          grid_v[i] = last_v;
        }

        /* stitch edges if necessary */
        if (unlikely(patch.needsStitching()))
          stitchUVGrid(patch.level,swidth,sheight,x0,y0,dwidth,dheight,grid_u,grid_v);
      
        /* iterates over all grid points */
        for (unsigned i=0; i<grid_size_simd_blocks; i++)
        {
          const vfloatx u = vfloatx::load(&grid_u[i*VSIZEX]);
          const vfloatx v = vfloatx::load(&grid_v[i*VSIZEX]);
          Vec3vfx vtx = patchEval(patch,u,v);
        
          /* evaluate displacement function */
          if (unlikely(geom->displFunc != nullptr))
          {
            const Vec3vfx normal = normalize_safe(patchNormal(patch, u, v));
            RTCDisplacementFunctionNArguments args;
            args.geometryUserPtr = geom->userPtr;
            args.geometry = (RTCGeometry)geom;
            //args.geomID = patch.geomID();
            args.primID = patch.primID();
            args.timeStep = patch.time();
            args.u = &u[0];
            args.v = &v[0];
            args.Ng_x = &normal.x[0];
            args.Ng_y = &normal.y[0];
            args.Ng_z = &normal.z[0];
            args.P_x = &vtx.x[0];
            args.P_y = &vtx.y[0];
            args.P_z = &vtx.z[0];
            args.N = VSIZEX;
            geom->displFunc(&args);
          }

          vfloatx::store(&grid_x[i*VSIZEX],vtx.x);
          vfloatx::store(&grid_y[i*VSIZEX],vtx.y);
          vfloatx::store(&grid_z[i*VSIZEX],vtx.z);
        }
      }
    }